

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APFloat * llvm::APFloat::getAllOnesValue(APFloat *__return_storage_ptr__,uint BitWidth,bool isIEEE)

{
  APInt local_78;
  APInt local_68;
  APInt local_58;
  APInt local_48;
  APInt local_38;
  APInt local_28;
  undefined1 local_15;
  uint local_14;
  bool isIEEE_local;
  APFloat *pAStack_10;
  uint BitWidth_local;
  
  local_15 = isIEEE;
  local_14 = BitWidth;
  pAStack_10 = __return_storage_ptr__;
  if (isIEEE) {
    if (BitWidth == 0x10) {
      APInt::getAllOnesValue(&local_28,0x10);
      APFloat(__return_storage_ptr__,(fltSemantics *)semIEEEhalf,&local_28);
      APInt::~APInt(&local_28);
    }
    else if (BitWidth == 0x20) {
      APInt::getAllOnesValue(&local_38,0x20);
      APFloat(__return_storage_ptr__,(fltSemantics *)semIEEEsingle,&local_38);
      APInt::~APInt(&local_38);
    }
    else if (BitWidth == 0x40) {
      APInt::getAllOnesValue(&local_48,0x40);
      APFloat(__return_storage_ptr__,(fltSemantics *)semIEEEdouble,&local_48);
      APInt::~APInt(&local_48);
    }
    else if (BitWidth == 0x50) {
      APInt::getAllOnesValue(&local_58,0x50);
      APFloat(__return_storage_ptr__,(fltSemantics *)semX87DoubleExtended,&local_58);
      APInt::~APInt(&local_58);
    }
    else {
      if (BitWidth != 0x80) {
        llvm_unreachable_internal
                  ("Unknown floating bit width",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                   ,0x1186);
      }
      APInt::getAllOnesValue(&local_68,0x80);
      APFloat(__return_storage_ptr__,(fltSemantics *)semIEEEquad,&local_68);
      APInt::~APInt(&local_68);
    }
  }
  else {
    if (BitWidth != 0x80) {
      __assert_fail("BitWidth == 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x1189,"static APFloat llvm::APFloat::getAllOnesValue(unsigned int, bool)");
    }
    APInt::getAllOnesValue(&local_78,0x80);
    APFloat(__return_storage_ptr__,(fltSemantics *)semPPCDoubleDouble,&local_78);
    APInt::~APInt(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

APFloat APFloat::getAllOnesValue(unsigned BitWidth, bool isIEEE) {
  if (isIEEE) {
    switch (BitWidth) {
    case 16:
      return APFloat(semIEEEhalf, APInt::getAllOnesValue(BitWidth));
    case 32:
      return APFloat(semIEEEsingle, APInt::getAllOnesValue(BitWidth));
    case 64:
      return APFloat(semIEEEdouble, APInt::getAllOnesValue(BitWidth));
    case 80:
      return APFloat(semX87DoubleExtended, APInt::getAllOnesValue(BitWidth));
    case 128:
      return APFloat(semIEEEquad, APInt::getAllOnesValue(BitWidth));
    default:
      llvm_unreachable("Unknown floating bit width");
    }
  } else {
    assert(BitWidth == 128);
    return APFloat(semPPCDoubleDouble, APInt::getAllOnesValue(BitWidth));
  }
}